

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Apu.cpp
# Opt level: O0

void __thiscall
Hes_Apu::osc_output(Hes_Apu *this,int index,Blip_Buffer *center,Blip_Buffer *left,Blip_Buffer *right
                   )

{
  Blip_Buffer *in_RCX;
  Blip_Buffer *in_RDX;
  int in_ESI;
  Hes_Apu *in_RDI;
  Blip_Buffer *in_R8;
  Hes_Osc *osc;
  Hes_Apu *local_30;
  
  in_RDI->oscs[in_ESI].chans[0] = in_RDX;
  in_RDI->oscs[in_ESI].chans[1] = in_RCX;
  in_RDI->oscs[in_ESI].chans[2] = in_R8;
  local_30 = (Hes_Apu *)&in_RDI->latch;
  do {
    local_30 = (Hes_Apu *)(local_30[-1].synth.impulses + 0xcc);
    balance_changed(in_RDI,(Hes_Osc *)local_30);
  } while (local_30 != in_RDI);
  return;
}

Assistant:

void Hes_Apu::osc_output( int index, Blip_Buffer* center, Blip_Buffer* left, Blip_Buffer* right )
{
	require( (unsigned) index < osc_count );
	oscs [index].chans [0] = center;
	oscs [index].chans [1] = left;
	oscs [index].chans [2] = right;
	
	Hes_Osc* osc = &oscs [osc_count];
	do
	{
		osc--;
		balance_changed( *osc );
	}
	while ( osc != oscs );
}